

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PZMatrixMarket.cpp
# Opt level: O0

void TPZMatrixMarket::Read<std::complex<double>>
               (string *filename,TPZFMatrix<std::complex<double>_> *fmat)

{
  char *pcVar1;
  void *pvVar2;
  istream *piVar3;
  long lVar4;
  long *in_RSI;
  string *in_RDI;
  int64_t swap;
  complex<double> val_1;
  int64_t col_1;
  int64_t row_1;
  int64_t el_1;
  string buf_1;
  ifstream input_1;
  complex<double> val;
  int64_t col;
  int64_t row;
  int64_t el;
  string buf;
  ifstream input;
  int64_t nlower;
  int64_t nsup;
  int64_t nonzero;
  int64_t ncol;
  int64_t nrow;
  complex<double> local_4e8;
  long local_4d8;
  long local_4d0;
  long local_4c8;
  string local_4c0 [32];
  istream local_4a0 [520];
  complex<double> local_298;
  long local_288;
  long local_280;
  long local_278;
  string local_260 [32];
  istream local_240 [520];
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long *local_10;
  
  local_28 = 0;
  local_30 = 0;
  local_38 = 0;
  local_10 = in_RSI;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_240,pcVar1,_S_in);
  std::__cxx11::string::string(local_260);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(local_240,local_260);
  pvVar2 = (void *)std::istream::operator>>(local_240,&local_18);
  pvVar2 = (void *)std::istream::operator>>(pvVar2,&local_20);
  std::istream::operator>>(pvVar2,&local_28);
  (**(code **)(*local_10 + 0x70))(local_10,local_18,local_20);
  for (local_278 = 0; local_278 < local_28; local_278 = local_278 + 1) {
    std::complex<double>::complex(&local_298,0.0,0.0);
    pvVar2 = (void *)std::istream::operator>>(local_240,&local_280);
    piVar3 = (istream *)std::istream::operator>>(pvVar2,&local_288);
    std::operator>>(piVar3,(complex *)&local_298);
    local_280 = local_280 + -1;
    local_288 = local_288 + -1;
    if (local_288 < local_280) {
      local_38 = local_38 + 1;
    }
    if (local_280 < local_288) {
      local_30 = local_30 + 1;
    }
    (**(code **)(*local_10 + 0x118))(local_10,local_280,local_288,&local_298);
  }
  std::__cxx11::string::~string(local_260);
  std::ifstream::~ifstream(local_240);
  if ((local_30 == 0) || (local_38 == 0)) {
    std::ifstream::ifstream(local_4a0,in_RDI,_S_in);
    std::__cxx11::string::string(local_4c0);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_4a0,local_4c0);
    pvVar2 = (void *)std::istream::operator>>(local_4a0,&local_18);
    pvVar2 = (void *)std::istream::operator>>(pvVar2,&local_20);
    std::istream::operator>>(pvVar2,&local_28);
    (**(code **)(*local_10 + 0x70))(local_10,local_18,local_20);
    for (local_4c8 = 0; local_4c8 < local_28; local_4c8 = local_4c8 + 1) {
      std::complex<double>::complex(&local_4e8,0.0,0.0);
      pvVar2 = (void *)std::istream::operator>>(local_4a0,&local_4d0);
      piVar3 = (istream *)std::istream::operator>>(pvVar2,&local_4d8);
      std::operator>>(piVar3,(complex *)&local_4e8);
      lVar4 = local_4d0 + -1;
      local_4d0 = local_4d8 + -1;
      local_4d8 = lVar4;
      (**(code **)(*local_10 + 0x118))(local_10,local_4d0,lVar4,&local_4e8);
    }
    std::__cxx11::string::~string(local_4c0);
    std::ifstream::~ifstream(local_4a0);
  }
  return;
}

Assistant:

void TPZMatrixMarket::Read(std::string filename, TPZFMatrix<T>&fmat)
{
    int64_t nrow,ncol,nonzero=0,nsup=0,nlower=0;
    {
        std::ifstream input(filename.c_str());
        std::string buf;
        std::getline(input,buf);
        input >> nrow >> ncol >> nonzero;
        fmat.Redim(nrow,ncol);
        for (int64_t el=0; el<nonzero; el++) {
            int64_t row, col;
            T val;
            input >> row >> col >> val;
            row--;
            col--;
            if(row > col) nlower++;
            if(row< col ) nsup++;
            fmat.PutVal(row,col,val);
        }
    }
    if(nsup == 0 || nlower == 0)
    {
        std::ifstream input(filename);
        std::string buf;
        std::getline(input,buf);
        input >> nrow >> ncol >> nonzero;
        fmat.Redim(nrow,ncol);
        for (int64_t el=0; el<nonzero; el++) {
            int64_t row, col;
            T val;
            input >> row >> col >> val;
            row--;
            col--;
            int64_t swap = row;
            row = col;
            col = swap;
            fmat.PutVal(row,col,val);
        }
    }
}